

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceListFieldsTest_MessageTest_Test::
~NoFieldPresenceListFieldsTest_MessageTest_Test
          (NoFieldPresenceListFieldsTest_MessageTest_Test *this)

{
  pointer ppFVar1;
  
  (this->super_NoFieldPresenceListFieldsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceListFieldsTest_0190f2b0;
  ppFVar1 = (this->super_NoFieldPresenceListFieldsTest).fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 != (pointer)0x0) {
    operator_delete(ppFVar1,(long)(this->super_NoFieldPresenceListFieldsTest).fields_.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar1
                   );
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceListFieldsTest).message_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

TEST_F(NoFieldPresenceListFieldsTest, MessageTest) {
  // Message fields always have explicit presence.
  message_.mutable_optional_nested_message();
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());

  fields_.clear();
  message_.Clear();
  message_.mutable_optional_nested_message()->set_bb(123);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());
}